

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareArguments_abi_cxx11_
          (string *__return_storage_ptr__,SmokeTest *this,testCase *test_case)

{
  string *psVar1;
  GLchar *pGVar2;
  size_t start_pos_2;
  size_t *local_108;
  string *sample;
  size_t start_pos_1;
  size_t *local_d8;
  string *offsets;
  size_t start_pos;
  size_t *local_a8;
  string *derivatives_1;
  string **local_80;
  string *derivatives_0;
  size_t position;
  size_t *local_50;
  string *coordinates;
  allocator<char> local_32;
  byte local_31;
  undefined1 *local_30;
  _texture_target *target;
  _texture_access *access;
  testCase *test_case_local;
  SmokeTest *this_local;
  string *arguments;
  
  target = (_texture_target *)(texture_access + test_case->m_texture_access_index * 0x18);
  local_30 = texture_targets + test_case->m_source_texture_target_index * 0x30;
  local_31 = 0;
  access = (_texture_access *)test_case;
  test_case_local = (testCase *)this;
  this_local = (SmokeTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"COORDINATESLODDERIVATIVESOFFSETSSAMPLE",&local_32);
  std::allocator<char>::~allocator(&local_32);
  prepareCoordinates_abi_cxx11_((string *)&position,this,(testCase *)access);
  local_50 = &position;
  derivatives_0 = (string *)0x0;
  pGVar2 = (GLchar *)std::__cxx11::string::c_str();
  Utils::replaceToken("COORDINATES",(size_t *)&derivatives_0,pGVar2,__return_storage_ptr__);
  if (((target->m_n_derivatives & 0x10000) == 0x10000) && ((local_30[0x21] & 1) == 1)) {
    Utils::replaceToken("LODDERIVATIVES",(size_t *)&derivatives_0,", int(0)",__return_storage_ptr__)
    ;
  }
  else if ((target->m_n_derivatives & 1) == 1) {
    prepareDerivatives_abi_cxx11_((string *)&derivatives_1,this,(testCase *)access,0);
    local_80 = &derivatives_1;
    prepareDerivatives_abi_cxx11_((string *)&start_pos,this,(testCase *)access,1);
    local_a8 = &start_pos;
    offsets = derivatives_0;
    Utils::replaceToken("LODDERIVATIVES",(size_t *)&derivatives_0,", XXXXX, XXXXX",
                        __return_storage_ptr__);
    derivatives_0 = (string *)&offsets->field_0x2;
    pGVar2 = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken("XXXXX",(size_t *)&derivatives_0,pGVar2,__return_storage_ptr__);
    pGVar2 = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken("XXXXX",(size_t *)&derivatives_0,pGVar2,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&start_pos);
    std::__cxx11::string::~string((string *)&derivatives_1);
  }
  else {
    Utils::replaceToken("LODDERIVATIVES",(size_t *)&derivatives_0,"",__return_storage_ptr__);
  }
  if ((target->m_n_derivatives & 0x1000000) == 0x1000000) {
    prepareOffsets_abi_cxx11_((string *)&start_pos_1,this,(testCase *)access);
    local_d8 = &start_pos_1;
    sample = derivatives_0;
    Utils::replaceToken("OFFSETS",(size_t *)&derivatives_0,", XXXXX",__return_storage_ptr__);
    derivatives_0 = (string *)&sample->field_0x2;
    pGVar2 = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken("XXXXX",(size_t *)&derivatives_0,pGVar2,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&start_pos_1);
  }
  else {
    Utils::replaceToken("OFFSETS",(size_t *)&derivatives_0,"",__return_storage_ptr__);
  }
  if (((local_30[0x24] & 1) == 1) && ((target->m_n_derivatives & 0x100000000) == 0x100000000)) {
    prepareSample_abi_cxx11_((string *)&start_pos_2,this);
    psVar1 = derivatives_0;
    local_108 = &start_pos_2;
    Utils::replaceToken("SAMPLE",(size_t *)&derivatives_0,", XX",__return_storage_ptr__);
    derivatives_0 = (string *)&psVar1->field_0x2;
    pGVar2 = (GLchar *)std::__cxx11::string::c_str();
    Utils::replaceToken("XX",(size_t *)&derivatives_0,pGVar2,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&start_pos_2);
  }
  else {
    Utils::replaceToken("SAMPLE",(size_t *)&derivatives_0,"",__return_storage_ptr__);
  }
  local_31 = 1;
  std::__cxx11::string::~string((string *)&position);
  if ((local_31 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SmokeTest::prepareArguments(const testCase& test_case)
{
	const _texture_access& access = texture_access[test_case.m_texture_access_index];
	const _texture_target& target = texture_targets[test_case.m_source_texture_target_index];

	std::string		   arguments   = "COORDINATESLODDERIVATIVESOFFSETSSAMPLE";
	const std::string& coordinates = prepareCoordinates(test_case);

	size_t position = 0;

	Utils::replaceToken("COORDINATES", position, coordinates.c_str(), arguments);

	if ((true == access.m_use_lod) && (true == target.m_support_lod))
	{
		Utils::replaceToken("LODDERIVATIVES", position, ", int(0)", arguments);
	}
	else if (true == access.m_use_derivaties)
	{
		const std::string& derivatives_0 = prepareDerivatives(test_case, 0);
		const std::string& derivatives_1 = prepareDerivatives(test_case, 1);
		const size_t	   start_pos	 = position;

		Utils::replaceToken("LODDERIVATIVES", position, ", XXXXX, XXXXX", arguments);
		position = start_pos + 2;
		Utils::replaceToken("XXXXX", position, derivatives_0.c_str(), arguments);
		Utils::replaceToken("XXXXX", position, derivatives_1.c_str(), arguments);
	}
	else
	{
		Utils::replaceToken("LODDERIVATIVES", position, "", arguments);
	}

	if (true == access.m_use_offsets)
	{
		const std::string& offsets   = prepareOffsets(test_case);
		const size_t	   start_pos = position;

		Utils::replaceToken("OFFSETS", position, ", XXXXX", arguments);
		position = start_pos + 2;
		Utils::replaceToken("XXXXX", position, offsets.c_str(), arguments);
	}
	else
	{
		Utils::replaceToken("OFFSETS", position, "", arguments);
	}

	if ((true == target.m_require_multisampling) && (true == access.m_support_multisampling))
	{
		const std::string& sample	= prepareSample();
		const size_t	   start_pos = position;

		Utils::replaceToken("SAMPLE", position, ", XX", arguments);
		position = start_pos + 2;
		Utils::replaceToken("XX", position, sample.c_str(), arguments);
	}
	else
	{
		Utils::replaceToken("SAMPLE", position, "", arguments);
	}

	return arguments;
}